

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_round3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  uint16_t uVar1;
  uint64_t qrecip_00;
  uint local_30;
  uint i;
  uint bias;
  uint64_t qrecip;
  uint q_local;
  uint p_local;
  uint16_t *in_local;
  uint16_t *out_local;
  
  qrecip_00 = reciprocal_for_reduction((uint16_t)q);
  ntru_mod3(out,in,p,q);
  for (local_30 = 0; local_30 < p; local_30 = local_30 + 1) {
    uVar1 = reduce((uint)in[local_30] + (q >> 1),(uint16_t)q,qrecip_00);
    out[local_30] = (uVar1 - (short)(q >> 1)) - out[local_30];
  }
  return;
}

Assistant:

void ntru_round3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    SETUP;
    unsigned bias = q/2;
    ntru_mod3(out, in, p, q);
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias) - bias - out[i];
}